

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int extension_bitmap_testandset(st_ptls_extension_bitmap_t *bitmap,int hstype,uint16_t extid)

{
  ulong local_30;
  uint64_t ext_bitmap_mask;
  uint64_t allowed_hs_bits;
  uint16_t extid_local;
  int hstype_local;
  st_ptls_extension_bitmap_t *bitmap_local;
  
  local_30 = 1;
  if (extid == 0) {
    ext_bitmap_mask = 0x204;
  }
  else {
    local_30 = 2;
    if (extid == 5) {
      ext_bitmap_mask = 0x5004;
    }
    else {
      local_30 = 4;
      if (extid == 10) {
        ext_bitmap_mask = 0x204;
      }
      else {
        local_30 = 8;
        if (extid == 0xd) {
          ext_bitmap_mask = 0x4004;
        }
        else {
          local_30 = 0x10;
          if (extid == 0x10) {
            ext_bitmap_mask = 0x204;
          }
          else {
            local_30 = 0x20;
            if (extid == 0x14) {
              ext_bitmap_mask = 0x204;
            }
            else {
              local_30 = 0x40;
              if (extid == 0x33) {
                ext_bitmap_mask = 0xd;
              }
              else {
                local_30 = 0x80;
                if (extid == 0x29) {
                  ext_bitmap_mask = 0xc;
                }
                else {
                  local_30 = 0x100;
                  if (extid == 0x2d) {
                    ext_bitmap_mask = 4;
                  }
                  else {
                    local_30 = 0x200;
                    if (extid == 0x2a) {
                      ext_bitmap_mask = 0x224;
                    }
                    else {
                      local_30 = 0x400;
                      if (extid == 0x2c) {
                        ext_bitmap_mask = 5;
                      }
                      else {
                        local_30 = 0x800;
                        if (extid == 0x2b) {
                          ext_bitmap_mask = 0xd;
                        }
                        else {
                          local_30 = 0x1000;
                          if (extid == 0x1b) {
                            ext_bitmap_mask = 0x4004;
                          }
                          else {
                            local_30 = 0x2000;
                            if (extid == 0xfe0d) {
                              ext_bitmap_mask = 0x205;
                            }
                            else {
                              local_30 = 0x4000;
                              if (extid != 0xfd00) {
                                return 1;
                              }
                              ext_bitmap_mask = 0;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if ((ext_bitmap_mask & 1L << ((char)hstype + 1U & 0x3f)) == 0) {
    bitmap_local._4_4_ = 0;
  }
  else if ((bitmap->bits & local_30) == 0) {
    bitmap->bits = local_30 | bitmap->bits;
    bitmap_local._4_4_ = 1;
  }
  else {
    bitmap_local._4_4_ = 0;
  }
  return bitmap_local._4_4_;
}

Assistant:

static int extension_bitmap_testandset(struct st_ptls_extension_bitmap_t *bitmap, int hstype, uint16_t extid)
{
#define HSTYPE_TO_BIT(hstype) ((uint64_t)1 << ((hstype) + 1)) /* min(hstype) is -1 (PSEUDO_HRR) */
#define DEFINE_BIT(abbrev, hstype) static const uint64_t abbrev = HSTYPE_TO_BIT(PTLS_HANDSHAKE_TYPE_##hstype)
#define EXT(candext, allowed_bits)                                                                                                 \
    do {                                                                                                                           \
        if (PTLS_UNLIKELY(extid == PTLS_EXTENSION_TYPE_##candext)) {                                                               \
            allowed_hs_bits = allowed_bits;                                                                                        \
            goto Found;                                                                                                            \
        }                                                                                                                          \
        ext_bitmap_mask <<= 1;                                                                                                     \
    } while (0)

    DEFINE_BIT(CH, CLIENT_HELLO);
    DEFINE_BIT(SH, SERVER_HELLO);
    DEFINE_BIT(HRR, PSEUDO_HRR);
    DEFINE_BIT(EE, ENCRYPTED_EXTENSIONS);
    DEFINE_BIT(CR, CERTIFICATE_REQUEST);
    DEFINE_BIT(CT, CERTIFICATE);
    DEFINE_BIT(NST, NEW_SESSION_TICKET);

    uint64_t allowed_hs_bits, ext_bitmap_mask = 1;

    /* clang-format off */
    /* RFC 8446 section 4.2: "The table below indicates the messages where a given extension may appear... If an implementation
     * receives an extension which it recognizes and which is not specified for the message in which it appears, it MUST abort the
     * handshake with an "illegal_parameter" alert.
     *
     * +-------------------------+---------------+
     * +        Extension        |    Allowed    |
     * +-------------------------+---------------+ */
    EXT( SERVER_NAME             , CH + EE       );
    EXT( STATUS_REQUEST          , CH + CR + CT  );
    EXT( SUPPORTED_GROUPS        , CH + EE       );
    EXT( SIGNATURE_ALGORITHMS    , CH + CR       );
    EXT( ALPN                    , CH + EE       );
    EXT( SERVER_CERTIFICATE_TYPE , CH + EE       );
    EXT( KEY_SHARE               , CH + SH + HRR );
    EXT( PRE_SHARED_KEY          , CH + SH       );
    EXT( PSK_KEY_EXCHANGE_MODES  , CH            );
    EXT( EARLY_DATA              , CH + EE + NST );
    EXT( COOKIE                  , CH + HRR      );
    EXT( SUPPORTED_VERSIONS      , CH + SH + HRR );
    EXT( COMPRESS_CERTIFICATE    , CH + CR       ); /* from RFC 8879 */
    EXT( ENCRYPTED_CLIENT_HELLO  , CH + HRR + EE ); /* from draft-ietf-tls-esni-15 */
    EXT( ECH_OUTER_EXTENSIONS    , 0             );
    /* +-----------------------------------------+ */
    /* clang-format on */

    return 1;

Found:
    if ((allowed_hs_bits & HSTYPE_TO_BIT(hstype)) == 0)
        return 0;
    if ((bitmap->bits & ext_bitmap_mask) != 0)
        return 0;
    bitmap->bits |= ext_bitmap_mask;
    return 1;

#undef HSTYPE_TO_BIT
#undef DEFINE_ABBREV
#undef EXT
}